

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

void uhash_close_63(UHashtable *hash)

{
  UHashElement *pUVar1;
  int32_t pos;
  int32_t local_1c;
  
  if (hash != (UHashtable *)0x0) {
    pUVar1 = hash->elements;
    if (pUVar1 != (UHashElement *)0x0) {
      if ((hash->keyDeleter != (UObjectDeleter *)0x0) ||
         (hash->valueDeleter != (UObjectDeleter *)0x0)) {
        local_1c = -1;
        while( true ) {
          pUVar1 = uhash_nextElement_63(hash,&local_1c);
          if (pUVar1 == (UHashElement *)0x0) break;
          if ((hash->keyDeleter != (UObjectDeleter *)0x0) && ((pUVar1->key).pointer != (void *)0x0))
          {
            (*hash->keyDeleter)((pUVar1->key).pointer);
          }
          if ((hash->valueDeleter != (UObjectDeleter *)0x0) &&
             ((pUVar1->value).pointer != (void *)0x0)) {
            (*hash->valueDeleter)((pUVar1->value).pointer);
          }
        }
        pUVar1 = hash->elements;
      }
      uprv_free_63(pUVar1);
      hash->elements = (UHashElement *)0x0;
    }
    if (hash->allocated != '\0') {
      uprv_free_63(hash);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_close(UHashtable *hash) {
    if (hash == NULL) {
        return;
    }
    if (hash->elements != NULL) {
        if (hash->keyDeleter != NULL || hash->valueDeleter != NULL) {
            int32_t pos=UHASH_FIRST;
            UHashElement *e;
            while ((e = (UHashElement*) uhash_nextElement(hash, &pos)) != NULL) {
                HASH_DELETE_KEY_VALUE(hash, e->key.pointer, e->value.pointer);
            }
        }
        uprv_free(hash->elements);
        hash->elements = NULL;
    }
    if (hash->allocated) {
        uprv_free(hash);
    }
}